

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

String __thiscall testing::FormatCxxExceptionMessage(testing *this,char *description,char *location)

{
  ostream *in_RAX;
  size_t sVar1;
  long lVar2;
  char *pcVar3;
  ostream *poVar4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar5;
  String SVar6;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  
  local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX;
  Message::Message((Message *)&local_28);
  poVar4 = (ostream *)(local_28.ptr_ + 0x10);
  if (local_28.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar4 = (ostream *)0x0;
  }
  if (description == (char *)0x0) {
    lVar2 = 0x15;
    pcVar3 = "Unknown C++ exception";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"C++ exception with description \"",0x20);
    poVar4 = (ostream *)(local_28.ptr_ + 0x10);
    if (local_28.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar4 = (ostream *)0x0;
    }
    sVar1 = strlen(description);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,description,sVar1);
    poVar4 = (ostream *)(local_28.ptr_ + 0x10);
    if (local_28.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar4 = (ostream *)0x0;
    }
    lVar2 = 1;
    pcVar3 = "\"";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,lVar2);
  poVar4 = (ostream *)(local_28.ptr_ + 0x10);
  if (local_28.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar4 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," thrown in ",0xb);
  if (location == (char *)0x0) {
    sVar5.ptr_ = local_28.ptr_ + 0x10;
    sVar1 = 6;
    location = "(null)";
  }
  else {
    sVar5.ptr_ = local_28.ptr_;
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      sVar5.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_28.ptr_ + 0x10);
    }
    sVar1 = strlen(location);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar5.ptr_,location,sVar1);
  poVar4 = (ostream *)(local_28.ptr_ + 0x10);
  if (local_28.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar4 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,".",1);
  SVar6 = internal::StringStreamToString((internal *)this,local_28.ptr_);
  if (local_28.ptr_ != (stringstream *)0x0) {
    SVar6 = (String)(**(code **)(*(long *)local_28.ptr_ + 8))();
  }
  return SVar6;
}

Assistant:

static internal::String FormatCxxExceptionMessage(const char* description,
                                                  const char* location) {
  Message message;
  if (description != NULL) {
    message << "C++ exception with description \"" << description << "\"";
  } else {
    message << "Unknown C++ exception";
  }
  message << " thrown in " << location << ".";

  return message.GetString();
}